

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

string * serialize_combined_abi_cxx11_
                   (char *serialized_model,char *serialized_model_ext,char *serialized_imputer,
                   char *serialized_indexer,char *optional_metadata,size_t size_optional_metadata)

{
  string *in_RDI;
  char *in_R9;
  char *ptr;
  string *serialized;
  size_t in_stack_00000228;
  char *in_stack_00000230;
  char *in_stack_00000238;
  char *in_stack_00000240;
  char *in_stack_00000248;
  char *in_stack_00000250;
  char **in_stack_00000260;
  size_t in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar1;
  
  uVar1 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  determine_serialized_size_combined
            (in_R9,(char *)CONCAT17(uVar1,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::resize((ulong)in_RDI);
  std::__cxx11::string::operator[]((ulong)in_RDI);
  serialize_combined<char*>
            (in_stack_00000250,in_stack_00000248,in_stack_00000240,in_stack_00000238,
             in_stack_00000230,in_stack_00000228,in_stack_00000260);
  return in_RDI;
}

Assistant:

std::string serialize_combined
(
    const char *serialized_model,
    const char *serialized_model_ext,
    const char *serialized_imputer,
    const char *serialized_indexer,
    const char *optional_metadata,
    const size_t size_optional_metadata
)
{
    std::string serialized;
    serialized.resize(
        determine_serialized_size_combined(
            serialized_model,
            serialized_model_ext,
            serialized_imputer,
            serialized_indexer,
            size_optional_metadata
        )
    );
    char *ptr = &serialized[0];
    serialize_combined(
        serialized_model,
        serialized_model_ext,
        serialized_imputer,
        serialized_indexer,
        optional_metadata,
        size_optional_metadata,
        ptr
    );
    return serialized;
}